

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> * __thiscall
SafeInt<long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
          (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *this,
          SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> bits)

{
  char cVar1;
  byte bVar2;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *this_00;
  
  this_00 = in_RDI;
  cVar1 = ::SafeInt::operator_cast_to_char
                    ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)in_RDI);
  if (cVar1 < '\0') {
    __assert_fail("!std::numeric_limits< U >::is_signed || (U)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x178b,
                  "SafeInt<T, E> &SafeInt<long>::operator<<=(SafeInt<U, E>) [T = long, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = char]"
                 );
  }
  cVar1 = ::SafeInt::operator_cast_to_char
                    ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this_00)
  ;
  if (cVar1 < '@') {
    bVar2 = ::SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       this_00);
    in_RDI->m_int = in_RDI->m_int << (bVar2 & 0x3f);
    return in_RDI;
  }
  __assert_fail("(U)bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x178c,
                "SafeInt<T, E> &SafeInt<long>::operator<<=(SafeInt<U, E>) [T = long, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = char]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator <<=( SafeInt< U, E > bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || (U)bits >= 0 );
        ShiftAssert( (U)bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int <<= (U)bits;
        return *this;
    }